

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  array<vec<4UL,_double>,_3UL> pts;
  vec3f eye;
  vec3f center;
  vec3f up;
  double dVar2;
  reference pvVar3;
  size_t __n;
  void *__buf;
  double in_stack_fffffffffffff910;
  allocator<char> local_6a9;
  string local_6a8;
  double local_688;
  double dStack_680;
  double local_678;
  double dStack_670;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  double dStack_640;
  double local_638;
  double dStack_630;
  vec4f local_620;
  int local_5fc;
  undefined1 auStack_5f8 [4];
  int j;
  array<vec<4UL,_double>,_3UL> screen_coords;
  size_t i;
  mat4 local_578;
  mat4 local_4f8;
  double local_478;
  double dStack_470;
  double local_468;
  double local_458;
  double dStack_450;
  double local_448;
  double local_438;
  double dStack_430;
  double local_428;
  _func_int **local_420;
  double dStack_418;
  double local_410;
  double dStack_408;
  double local_400;
  double dStack_3f8;
  double local_3f0;
  double dStack_3e8;
  double local_3e0;
  double dStack_3d8;
  double local_3d0;
  double dStack_3c8;
  double local_3c0;
  double dStack_3b8;
  double local_3b0;
  double dStack_3a8;
  undefined1 local_3a0 [8];
  GouraudShader shader;
  DepthBuffer zbuffer;
  TGAImage image;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  Model model;
  
  model.specularmap_._36_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"obj/african_head.obj",&local_139);
  Model::Model((Model *)local_118,&local_138,true,false,false);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  vec<3UL,_double>::normalize(&light_dir);
  TGAImage::TGAImage((TGAImage *)
                     &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,800,800,3);
  DepthBuffer::DepthBuffer((DepthBuffer *)&shader.uniform_light_dir.z,800,800);
  GouraudShader::GouraudShader((GouraudShader *)local_3a0);
  local_428 = ::eye.z;
  local_438 = ::eye.x;
  dStack_430 = ::eye.y;
  local_448 = ::center.z;
  local_458 = ::center.x;
  dStack_450 = ::center.y;
  local_468 = ::up.z;
  local_478 = ::up.x;
  dStack_470 = ::up.y;
  eye.y = ::eye.z;
  eye.x = ::eye.y;
  eye.z = ::center.x;
  center.y = ::center.z;
  center.x = ::center.y;
  center.z = ::up.x;
  up.y = ::up.z;
  up.x = ::up.y;
  up.z = in_stack_fffffffffffff910;
  lookat(eye,center,up);
  shader.super_IShader.uniform_ModelView.rows[3].data[1] = local_3b0;
  shader.super_IShader.uniform_ModelView.rows[3].data[2] = dStack_3a8;
  shader.super_IShader.uniform_ModelView.rows[2].data[3] = local_3c0;
  shader.super_IShader.uniform_ModelView.rows[3].data[0] = dStack_3b8;
  shader.super_IShader.uniform_ModelView.rows[2].data[1] = local_3d0;
  shader.super_IShader.uniform_ModelView.rows[2].data[2] = dStack_3c8;
  shader.super_IShader.uniform_ModelView.rows[1].data[3] = local_3e0;
  shader.super_IShader.uniform_ModelView.rows[2].data[0] = dStack_3d8;
  shader.super_IShader.uniform_ModelView.rows[1].data[1] = local_3f0;
  shader.super_IShader.uniform_ModelView.rows[1].data[2] = dStack_3e8;
  shader.super_IShader.uniform_ModelView.rows[0].data[3] = local_400;
  shader.super_IShader.uniform_ModelView.rows[1].data[0] = dStack_3f8;
  shader.super_IShader.uniform_ModelView.rows[0].data[1] = local_410;
  shader.super_IShader.uniform_ModelView.rows[0].data[2] = dStack_408;
  shader.super_IShader._vptr_IShader = local_420;
  shader.super_IShader.uniform_ModelView.rows[0].data[0] = dStack_418;
  viewport(&local_4f8,100,100,600,600);
  shader.super_IShader.uniform_Viewport.rows[3].data[1] = local_4f8.rows[3].data[2];
  shader.super_IShader.uniform_Viewport.rows[3].data[2] = local_4f8.rows[3].data[3];
  shader.super_IShader.uniform_Viewport.rows[2].data[3] = local_4f8.rows[3].data[0];
  shader.super_IShader.uniform_Viewport.rows[3].data[0] = local_4f8.rows[3].data[1];
  shader.super_IShader.uniform_Viewport.rows[2].data[1] = local_4f8.rows[2].data[2];
  shader.super_IShader.uniform_Viewport.rows[2].data[2] = local_4f8.rows[2].data[3];
  shader.super_IShader.uniform_Viewport.rows[1].data[3] = local_4f8.rows[2].data[0];
  shader.super_IShader.uniform_Viewport.rows[2].data[0] = local_4f8.rows[2].data[1];
  shader.super_IShader.uniform_Viewport.rows[1].data[1] = local_4f8.rows[1].data[2];
  shader.super_IShader.uniform_Viewport.rows[1].data[2] = local_4f8.rows[1].data[3];
  shader.super_IShader.uniform_Viewport.rows[0].data[3] = local_4f8.rows[1].data[0];
  shader.super_IShader.uniform_Viewport.rows[1].data[0] = local_4f8.rows[1].data[1];
  shader.super_IShader.uniform_Viewport.rows[0].data[1] = local_4f8.rows[0].data[2];
  shader.super_IShader.uniform_Viewport.rows[0].data[2] = local_4f8.rows[0].data[3];
  shader.super_IShader.uniform_ModelView.rows[3].data[3] = local_4f8.rows[0].data[0];
  shader.super_IShader.uniform_Viewport.rows[0].data[0] = local_4f8.rows[0].data[1];
  operator-((vec<3UL,_double> *)&i,&::eye,&::center);
  dVar1 = vec<3UL,_double>::norm((vec<3UL,_double> *)&i);
  projection(&local_578,-1.0 / dVar1);
  memcpy(shader.super_IShader.uniform_Viewport.rows[3].data + 3,&local_578,0x80);
  shader.varying_ity.z = light_dir.x;
  shader.uniform_light_dir.x = light_dir.y;
  shader.uniform_light_dir.y = light_dir.z;
  screen_coords._M_elems[2].data[3] = 0.0;
  while( true ) {
    dVar1 = screen_coords._M_elems[2].data[3];
    dVar2 = (double)Model::nfaces((Model *)local_118);
    if ((ulong)dVar2 <= (ulong)dVar1) break;
    std::array<vec<4UL,_double>,_3UL>::array((array<vec<4UL,_double>,_3UL> *)auStack_5f8);
    for (local_5fc = 0; local_5fc < 3; local_5fc = local_5fc + 1) {
      GouraudShader::vertex
                (&local_620,(GouraudShader *)local_3a0,(Model *)local_118,
                 screen_coords._M_elems[2].data[3]._0_4_,local_5fc);
      pvVar3 = std::array<vec<4UL,_double>,_3UL>::operator[]
                         ((array<vec<4UL,_double>,_3UL> *)auStack_5f8,(long)local_5fc);
      pvVar3->data[0] = local_620.data[0];
      pvVar3->data[1] = local_620.data[1];
      pvVar3->data[2] = local_620.data[2];
      pvVar3->data[3] = local_620.data[3];
    }
    local_638 = screen_coords._M_elems[2].data[1];
    dStack_630 = screen_coords._M_elems[2].data[2];
    local_648 = screen_coords._M_elems[1].data[3];
    dStack_640 = screen_coords._M_elems[2].data[0];
    local_658 = screen_coords._M_elems[1].data[1];
    dStack_650 = screen_coords._M_elems[1].data[2];
    local_668 = screen_coords._M_elems[0].data[3];
    dStack_660 = screen_coords._M_elems[1].data[0];
    local_678 = screen_coords._M_elems[0].data[1];
    dStack_670 = screen_coords._M_elems[0].data[2];
    local_688 = _auStack_5f8;
    dStack_680 = screen_coords._M_elems[0].data[0];
    pts._M_elems[0].data[1] = screen_coords._M_elems[0].data[0];
    pts._M_elems[0].data[0] = _auStack_5f8;
    pts._M_elems[0].data[2] = screen_coords._M_elems[0].data[1];
    pts._M_elems[0].data[3] = screen_coords._M_elems[0].data[2];
    pts._M_elems[1].data[0] = screen_coords._M_elems[0].data[3];
    pts._M_elems[1].data[1] = screen_coords._M_elems[1].data[0];
    pts._M_elems[1].data[2] = screen_coords._M_elems[1].data[1];
    pts._M_elems[1].data[3] = screen_coords._M_elems[1].data[2];
    pts._M_elems[2].data[0] = screen_coords._M_elems[1].data[3];
    pts._M_elems[2].data[1] = screen_coords._M_elems[2].data[0];
    pts._M_elems[2].data[2] = screen_coords._M_elems[2].data[1];
    pts._M_elems[2].data[3] = screen_coords._M_elems[2].data[2];
    triangle((Model *)local_118,pts,(IShader *)local_3a0,
             (TGAImage *)
             &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(DepthBuffer *)&shader.uniform_light_dir.z);
    screen_coords._M_elems[2].data[3] = (double)((long)screen_coords._M_elems[2].data[3] + 1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"output.tga",&local_6a9);
  __n = 1;
  TGAImage::write_tga_file
            ((TGAImage *)
             &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_6a8,true,true);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  DepthBuffer::write((DepthBuffer *)&shader.uniform_light_dir.z,0x10e040,__buf,__n);
  model.specularmap_._36_4_ = 0;
  GouraudShader::~GouraudShader((GouraudShader *)local_3a0);
  DepthBuffer::~DepthBuffer((DepthBuffer *)&shader.uniform_light_dir.z);
  TGAImage::~TGAImage((TGAImage *)
                      &zbuffer.data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Model::~Model((Model *)local_118);
  return model.specularmap_._36_4_;
}

Assistant:

int main()
{
    Model model{"obj/african_head.obj", true, false, false};

    light_dir.normalize();

    TGAImage image(width, height, TGAImage::RGB);
    DepthBuffer zbuffer(width, height);

    GouraudShader shader;
    shader.uniform_ModelView = lookat(eye, center, up);
    shader.uniform_Viewport = viewport(width / 8, height / 8, width * 3 / 4, height * 3 / 4);
    shader.uniform_Projection = projection(-1. / (eye - center).norm());
    shader.uniform_light_dir = light_dir;
    for (size_t i = 0; i < model.nfaces(); i++) {
        std::array<vec4f, 3> screen_coords;
        for (int j = 0; j < 3; j++) {
            screen_coords[j] = shader.vertex(model, i, j);
        }
        triangle(model, screen_coords, shader, image, zbuffer);
    }

    // image.flip_vertically();  // to place the origin in the bottom left corner of the image
    // zbuffer.flip_vertically();
    image.write_tga_file("output.tga");
    zbuffer.write("zbuffer.tga");

    return 0;
}